

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ClassEscapePass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,MatchCharNode *deferredCharNode,
          MatchSetNode *deferredSetNode,bool *previousSurrogatePart)

{
  StandardChars<unsigned_char> *pSVar1;
  code *pcVar2;
  bool bVar3;
  EncodedChar EVar4;
  Char CVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  bool local_61;
  Char local_3e;
  uint local_3c;
  uint uStack_38;
  Char c;
  uint m;
  CharCount digits;
  uint n;
  bool *previousSurrogatePart_local;
  MatchSetNode *deferredSetNode_local;
  MatchCharNode *deferredCharNode_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  _digits = previousSurrogatePart;
  previousSurrogatePart_local = (bool *)deferredSetNode;
  deferredSetNode_local = (MatchSetNode *)deferredCharNode;
  deferredCharNode_local = (MatchCharNode *)this;
  bVar3 = IsEOF(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xa06,"(!IsEOF())","!IsEOF()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  pSVar1 = this->standardEncodedChars;
  EVar4 = ECLookahead(this,0);
  bVar3 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
  if (!bVar3) {
    local_3e = NextChar(this);
    switch(local_3e) {
    case L'D':
      StandardChars<char16_t>::SetNonDigits
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    default:
      break;
    case L'S':
      StandardChars<char16_t>::SetNonWhitespace
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    case L'W':
      StandardChars<char16_t>::SetNonWordChars
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    case L'b':
      local_3e = L'\b';
      break;
    case L'c':
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      bVar3 = StandardChars<unsigned_char>::IsWord(pSVar1,EVar4);
      if (!bVar3) {
        ECRevert(this,1);
        deferredSetNode_local->isNegation = true;
        deferredSetNode_local->needsEquivClass = false;
        return &deferredSetNode_local->super_Node;
      }
      EVar4 = ECLookahead(this,0);
      uVar7 = Chars<unsigned_char>::CTU(EVar4);
      local_3e = Chars<char16_t>::UTC(uVar7 & 0x1f);
      ECConsume(this,1);
      break;
    case L'd':
      StandardChars<char16_t>::SetDigits
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    case L'f':
      local_3e = L'\f';
      break;
    case L'n':
      local_3e = L'\n';
      break;
    case L'r':
      local_3e = L'\r';
      break;
    case L's':
      StandardChars<char16_t>::SetWhitespace
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    case L't':
      local_3e = L'\t';
      break;
    case L'u':
      if ((((this->unicodeFlagPresent & 1U) == 0) ||
          (iVar6 = TryParseExtendedUnicodeEscape(this,&local_3e,_digits,false), iVar6 < 1)) &&
         (bVar3 = ECCanConsume(this,4), bVar3)) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,2);
            bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,3);
              bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
              if (bVar3) {
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,0);
                uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,1);
                uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,2);
                uVar9 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                pSVar1 = this->standardEncodedChars;
                EVar4 = ECLookahead(this,3);
                uVar10 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
                local_3e = Chars<char16_t>::UTC(uVar7 << 0xc | uVar8 << 8 | uVar9 << 4 | uVar10);
                ECConsume(this,4);
              }
            }
          }
        }
      }
      break;
    case L'v':
      local_3e = L'\v';
      break;
    case L'w':
      StandardChars<char16_t>::SetWordChars
                (this->standardChars,this->ctAllocator,
                 (CharSet<char16_t> *)(previousSurrogatePart_local + 0x40));
      return (Node *)previousSurrogatePart_local;
    case L'x':
      bVar3 = ECCanConsume(this,2);
      if (bVar3) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,0);
        bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
        if (bVar3) {
          pSVar1 = this->standardEncodedChars;
          EVar4 = ECLookahead(this,1);
          bVar3 = StandardChars<unsigned_char>::IsHex(pSVar1,EVar4);
          if (bVar3) {
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,0);
            uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
            pSVar1 = this->standardEncodedChars;
            EVar4 = ECLookahead(this,1);
            uVar8 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
            local_3e = Chars<char16_t>::UTC(uVar7 << 4 | uVar8);
            ECConsume(this,2);
          }
        }
      }
    }
    deferredSetNode_local->isNegation = (bool)(undefined1)local_3e;
    deferredSetNode_local->needsEquivClass = (bool)local_3e._1_1_;
    return &deferredSetNode_local->super_Node;
  }
  m = 0;
  uStack_38 = 0;
  do {
    iVar6 = m * 8;
    pSVar1 = this->standardEncodedChars;
    EVar4 = ECLookahead(this,0);
    uVar7 = StandardChars<unsigned_char>::DigitValue(pSVar1,EVar4);
    local_3c = iVar6 + uVar7;
    if (0xff < local_3c) break;
    m = local_3c;
    ECConsume(this,1);
    uStack_38 = uStack_38 + 1;
    local_61 = false;
    if (uStack_38 < 3) {
      pSVar1 = this->standardEncodedChars;
      EVar4 = ECLookahead(this,0);
      local_61 = StandardChars<unsigned_char>::IsOctal(pSVar1,EVar4);
    }
  } while (local_61 != false);
  CVar5 = Chars<char16_t>::UTC(m & 0xffff);
  deferredSetNode_local->isNegation = (bool)(char)CVar5;
  deferredSetNode_local->needsEquivClass = (bool)(char)((ushort)CVar5 >> 8);
  return &deferredSetNode_local->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::ClassEscapePass1(MatchCharNode* deferredCharNode, MatchSetNode* deferredSetNode, bool& previousSurrogatePart)
    {
        // Checked for terminating 0 is pass 0
        Assert(!IsEOF());
        if (standardEncodedChars->IsOctal(ECLookahead()))
        {
            // As per Annex B, allow octal escapes instead of just \0 (and \8 and \9 are identity escapes).
            // Must be between 1 and 3 octal digits.
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            deferredCharNode->cs[0] = UTC((UChar)n);
            return deferredCharNode;
        }
        else
        {
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                c = '\b';
                break; // fall-through for identity escape
            case 'f':
                c = '\f';
                break; // fall-through for identity escape
            case 'n':
                c = '\n';
                break; // fall-through for identity escape
            case 'r':
                c = '\r';
                break; // fall-through for identity escape
            case 't':
                c = '\t';
                break; // fall-through for identity escape
            case 'v':
                c = '\v';
                break; // fall-through for identity escape
            case 'd':
                standardChars->SetDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'D':
                standardChars->SetNonDigits(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 's':
                standardChars->SetWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'S':
                standardChars->SetNonWhitespace(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'w':
                standardChars->SetWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'W':
                standardChars->SetNonWordChars(ctAllocator, deferredSetNode->set);
                return deferredSetNode;
            case 'c':
                if (standardEncodedChars->IsWord(ECLookahead())) // terminating 0 is not a word character
                {
                    c = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                    // fall-through for identity escape
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    deferredCharNode->cs[0] = '\\';
                    return deferredCharNode;
                }
                break;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B
                break;
            case 'u':
                if (unicodeFlagPresent && TryParseExtendedUnicodeEscape(c, previousSurrogatePart) > 0)
                    break;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    c = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    ECConsume(4);
                    // fall-through for identity escape
                }
                // Take to be identity escape if ill-formed as per Annex B.
                break;
            default:
                // As per Annex B, allow anything other than newlines and above. Embedded 0 is ok.
                break;
            }

            // Must be an identity escape
            deferredCharNode->cs[0] = c;
            return deferredCharNode;
        }
    }